

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O3

BOOL __thiscall
Js::ModuleRoot::SetRootProperty
          (ModuleRoot *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  HostObjectBase *pHVar1;
  PropertyIndex PVar2;
  int iVar3;
  BOOL BVar4;
  BOOL BVar5;
  BOOL local_3c;
  PropertyValueInfo *pPStack_38;
  BOOL setAttempted;
  
  pPStack_38 = info;
  PVar2 = RootObjectBase::GetRootPropertyIndex(&this->super_RootObjectBase,propertyId);
  if (PVar2 == 0xffff) {
    pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
    if ((pHVar1 != (HostObjectBase *)0x0) &&
       (iVar3 = (**(code **)(*(long *)pHVar1 + 0x58))(pHVar1,propertyId,0), iVar3 == 1)) {
      pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
      BVar4 = (**(code **)(*(long *)pHVar1 + 0xb8))(pHVar1,propertyId,value,flags,0);
      return BVar4;
    }
    local_3c = 1;
    BVar4 = GlobalObject::SetExistingRootProperty
                      ((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                           type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       globalObject.ptr,propertyId,value,(PropertyValueInfo *)0x0,&local_3c);
    BVar5 = 1;
    if ((BVar4 == 0) && (BVar5 = 0, local_3c == 0)) {
      BVar5 = RootObjectBase::SetRootProperty
                        (&this->super_RootObjectBase,propertyId,value,
                         flags | PropertyOperation_NonFixedValue,pPStack_38);
    }
  }
  else {
    iVar3 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x30])(this,(ulong)(uint)propertyId);
    if (iVar3 == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode
                (flags,(((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                           type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       scriptContext.ptr);
      iVar3 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x23])(this,(ulong)(uint)propertyId);
      BVar5 = 0;
      if (iVar3 == 0) {
        if (pPStack_38 == (PropertyValueInfo *)0x0) {
          return 0;
        }
        pPStack_38->m_instance = (RecyclableObject *)this;
        pPStack_38->m_propertyIndex = PVar2;
        pPStack_38->m_attributes = '\0';
        pPStack_38->flags = InlineCacheNoFlags;
        return 0;
      }
    }
    else {
      BVar5 = 1;
      DynamicObject::SetSlot((DynamicObject *)this,propertyId,true,(uint)PVar2,value);
      iVar3 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x23])(this,(ulong)(uint)propertyId);
      if (iVar3 == 0) {
        if (pPStack_38 == (PropertyValueInfo *)0x0) {
          return 1;
        }
        pPStack_38->m_instance = (RecyclableObject *)this;
        pPStack_38->m_propertyIndex = PVar2;
        pPStack_38->m_attributes = '\x04';
        pPStack_38->flags = InlineCacheNoFlags;
        return 1;
      }
    }
    if (pPStack_38 != (PropertyValueInfo *)0x0) {
      pPStack_38->m_instance = (RecyclableObject *)this;
      pPStack_38->m_propertyIndex = 0xffff;
      pPStack_38->m_attributes = '\0';
      pPStack_38->flags = InlineCacheNoFlags;
    }
  }
  return BVar5;
}

Assistant:

BOOL ModuleRoot::SetRootProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        PropertyIndex index = GetRootPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
            if (this->IsWritable(propertyId) == FALSE)
            {
                JavascriptError::ThrowCantAssignIfStrictMode(flags, this->GetScriptContext());

#if ENABLE_FIXED_FIELDS
                if (this->IsFixedProperty(propertyId))
                {
                    PropertyValueInfo::SetNoCache(info, this);
                }
                else
#endif
                {
                    PropertyValueInfo::Set(info, this, index, PropertyNone); // Try to cache property info even if not writable
                }
                return FALSE;
            }
            this->SetSlot(SetSlotArgumentsRoot(propertyId, true, index, value));
#if ENABLE_FIXED_FIELDS
            if (this->IsFixedProperty(propertyId))
            {
                PropertyValueInfo::SetNoCache(info, this);
            }
            else
#endif
            {
                PropertyValueInfo::Set(info, this, index);
            }            
            return TRUE;
        }
        else if (this->hostObject && this->hostObject->HasProperty(propertyId))
        {
            return this->hostObject->SetProperty(propertyId, value, flags, NULL);
        }

        //
        // Try checking the global object
        // if the module root doesn't have the property and the host object also doesn't have it
        //
        GlobalObject* globalObj = this->GetLibrary()->GetGlobalObject();
        BOOL setAttempted = TRUE;
        if (globalObj->SetExistingRootProperty(propertyId, value, NULL, &setAttempted))
        {
            return TRUE;
        }

        //
        // Set was attempted. But the set operation returned false.
        // This happens, when the property is read only.
        // In those scenarios, we should be setting the property with default attributes
        //
        if (setAttempted)
        {
            return FALSE;
        }

        return __super::SetRootProperty(propertyId, value, (PropertyOperationFlags)(flags | PropertyOperation_NonFixedValue), info);
    }